

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32_t res)

{
  pair<const_char_*,_int> pVar1;
  char *local_68;
  int local_5c;
  void *local_58;
  int local_4c;
  void *local_48;
  uint local_3c;
  char *pcStack_38;
  uint32_t byte;
  uint local_2c;
  uint local_28;
  uint32_t byte_1;
  uint32_t i;
  uint32_t res_local;
  char *p_local;
  undefined4 local_10;
  
  local_28 = 1;
  byte_1 = res;
  do {
    _i = p;
    if (3 < local_28) {
      local_3c = (uint)(byte)p[4];
      if (local_3c < 8) {
        byte_1 = (local_3c - 1) * 0x10000000 + byte_1;
        if (byte_1 < 0x7ffffff0) {
          local_68 = p + 5;
          std::pair<const_char_*,_int>::pair<const_char_*,_unsigned_int_&,_true>
                    ((pair<const_char_*,_int> *)&p_local,&local_68,&byte_1);
        }
        else {
          local_58 = (void *)0x0;
          local_5c = 0;
          std::pair<const_char_*,_int>::pair<std::nullptr_t,_int,_true>
                    ((pair<const_char_*,_int> *)&p_local,&local_58,&local_5c);
        }
      }
      else {
        local_48 = (void *)0x0;
        local_4c = 0;
        std::pair<const_char_*,_int>::pair<std::nullptr_t,_int,_true>
                  ((pair<const_char_*,_int> *)&p_local,&local_48,&local_4c);
      }
LAB_005704f4:
      pVar1._12_4_ = 0;
      pVar1.first = p_local;
      pVar1.second = local_10;
      return pVar1;
    }
    local_2c = (uint)(byte)p[local_28];
    byte_1 = (local_2c - 1 << ((char)local_28 * '\a' & 0x1fU)) + byte_1;
    if (local_2c < 0x80) {
      pcStack_38 = p + (ulong)local_28 + 1;
      std::pair<const_char_*,_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_int> *)&p_local,&stack0xffffffffffffffc8,&byte_1);
      goto LAB_005704f4;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::pair<const char*, int32_t> ReadSizeFallback(const char* p, uint32_t res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8_t>(p[4]);
  if (ABSL_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (ABSL_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}